

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalBlockStatement(Evaluator *this,BlockStmt *block,Env *env)

{
  pointer ppSVar1;
  GCPtr<symbols::Object> GVar2;
  bool bVar3;
  int iVar4;
  Env *this_00;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar5;
  pointer ppSVar6;
  string local_60;
  string local_40;
  
  this_00 = NewEnvironment(env);
  bVar3 = symbols::Env::is_recurseLimitExceeded(this_00);
  if (bVar3) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"RecursionLimitExceeded: ","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"recursion depth exceeded limit","");
    newError(this,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ppSVar1 = (block->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar6 = (block->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; GVar2.addr = NATIVE_NULL.addr,
        ppSVar6 != ppSVar1; ppSVar6 = ppSVar6 + 1) {
      Eval(this,&(*ppSVar6)->super_Node,this_00);
      if ((*(undefined8 **)this != (undefined8 *)0x0) &&
         (iVar4 = (**(code **)**(undefined8 **)this)(), iVar4 - 3U < 2)) {
        return (GCPtr<symbols::Object>)(Object *)this;
      }
      GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)this);
    }
    plVar5 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar5 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar5->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar5 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar5 + 0x10U + 8) != (_List_node_base *)NATIVE_NULL.addr)
    ;
    *(int *)((long)plVar5 + 0x10U) = *(int *)((long)plVar5 + 0x10U) + 1;
    *(Object **)this = GVar2.addr;
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalBlockStatement(BlockStmt* block, Env* env){
    auto scope = NewEnvironment(env);
    if(scope->is_recurseLimitExceeded())
        return newError("RecursionLimitExceeded: ", "recursion depth exceeded limit");

    for(auto stmt : block->Stmts){
        GCPtr<Object> result = Eval(stmt, scope);
        if(result != nullptr){
            auto type = result->type();
            if(type == Types::RETURNTYPE || type == Types::ERRORTYPE){
                return result;
            }
        }
    }
    return NATIVE_NULL;
}